

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O1

MPP_RET set_enc_info_to_packet(MppEncImpl *enc,HalEncTask *hal_task)

{
  RK_U32 val;
  void *pvVar1;
  EncRcTask *pEVar2;
  MPP_RET MVar3;
  MPP_RET extraout_EAX;
  MppMeta meta;
  bool bVar4;
  
  pvVar1 = enc->mpp;
  pEVar2 = hal_task->rc_task;
  meta = mpp_packet_get_meta(hal_task->packet);
  if (meta == (MppMeta)0x0) {
    _mpp_log_l(2,"mpp_enc","failed to get meta from packet\n","set_enc_info_to_packet");
    return extraout_EAX;
  }
  if ((enc->coding == MPP_VIDEO_CodingHEVC) || (enc->coding == MPP_VIDEO_CodingAVC)) {
    val = (pEVar2->info).lvl64_inter_num;
    if (((val == 0) &&
        ((((pEVar2->info).lvl32_inter_num == 0 && ((pEVar2->info).lvl16_inter_num == 0)) &&
         ((pEVar2->info).lvl8_inter_num == 0)))) &&
       ((((pEVar2->info).lvl32_intra_num == 0 && ((pEVar2->info).lvl16_intra_num == 0)) &&
        ((pEVar2->info).lvl8_intra_num == 0)))) {
      bVar4 = (pEVar2->info).lvl4_intra_num == 0;
    }
    else {
      bVar4 = false;
    }
    mpp_meta_set_s32(meta,KEY_LVL64_INTER_NUM,val);
    mpp_meta_set_s32(meta,KEY_LVL32_INTER_NUM,(pEVar2->info).lvl32_inter_num);
    mpp_meta_set_s32(meta,KEY_LVL16_INTER_NUM,(pEVar2->info).lvl16_inter_num);
    mpp_meta_set_s32(meta,KEY_LVL8_INTER_NUM,(pEVar2->info).lvl8_inter_num);
    mpp_meta_set_s32(meta,KEY_LVL32_INTRA_NUM,(pEVar2->info).lvl32_intra_num);
    mpp_meta_set_s32(meta,KEY_LVL16_INTRA_NUM,(pEVar2->info).lvl16_intra_num);
    mpp_meta_set_s32(meta,KEY_LVL8_INTRA_NUM,(pEVar2->info).lvl8_intra_num);
    mpp_meta_set_s32(meta,KEY_LVL4_INTRA_NUM,(pEVar2->info).lvl4_intra_num);
    mpp_meta_set_s64(meta,KEY_ENC_SSE,(pEVar2->info).sse);
    mpp_meta_set_s32(meta,KEY_OUTPUT_PSKIP,(byte)((byte)((pEVar2->frm).val >> 0x24) | bVar4) & 1);
    mpp_meta_set_s32(meta,KEY_ENC_BPS_RT,(pEVar2->info).rt_bits);
    if ((pEVar2->info).frame_type == INTER_VI_FRAME) {
      mpp_meta_set_s32(meta,KEY_ENC_USE_LTR,*(uint *)&(pEVar2->cpb).refr >> 8 & 0xf);
    }
  }
  mpp_meta_set_s32(meta,KEY_OUTPUT_INTRA,*(uint *)&pEVar2->frm >> 4 & 1);
  mpp_meta_set_s32(meta,KEY_ENC_START_QP,(pEVar2->info).quality_target);
  MVar3 = mpp_meta_set_s32(meta,KEY_ENC_AVERAGE_QP,(pEVar2->info).quality_real);
  if (hal_task->md_info != (MppBuffer)0x0) {
    MVar3 = mpp_meta_set_buffer(meta,KEY_MOTION_INFO,hal_task->md_info);
  }
  if (*(int *)((long)pvVar1 + 0xb8) != 0) {
    MVar3 = mpp_meta_set_frame(meta,KEY_INPUT_FRAME,hal_task->frame);
    return MVar3;
  }
  return MVar3;
}

Assistant:

static MPP_RET set_enc_info_to_packet(MppEncImpl *enc, HalEncTask *hal_task)
{
    Mpp *mpp = (Mpp*)enc->mpp;
    EncRcTask *rc_task = hal_task->rc_task;
    EncFrmStatus *frm = &rc_task->frm;
    MppPacket packet = hal_task->packet;
    MppMeta meta = mpp_packet_get_meta(packet);

    if (!meta) {
        mpp_err_f("failed to get meta from packet\n");
        return MPP_NOK;
    }

    if (enc->coding == MPP_VIDEO_CodingHEVC || enc->coding == MPP_VIDEO_CodingAVC) {
        RK_U32 is_pskip = !(rc_task->info.lvl64_inter_num ||
                            rc_task->info.lvl32_inter_num ||
                            rc_task->info.lvl16_inter_num ||
                            rc_task->info.lvl8_inter_num  ||
                            rc_task->info.lvl32_intra_num ||
                            rc_task->info.lvl16_intra_num ||
                            rc_task->info.lvl8_intra_num  ||
                            rc_task->info.lvl4_intra_num);

        /* num of inter different size predicted block */
        mpp_meta_set_s32(meta, KEY_LVL64_INTER_NUM, rc_task->info.lvl64_inter_num);
        mpp_meta_set_s32(meta, KEY_LVL32_INTER_NUM, rc_task->info.lvl32_inter_num);
        mpp_meta_set_s32(meta, KEY_LVL16_INTER_NUM, rc_task->info.lvl16_inter_num);
        mpp_meta_set_s32(meta, KEY_LVL8_INTER_NUM,  rc_task->info.lvl8_inter_num);
        /* num of intra different size predicted block */
        mpp_meta_set_s32(meta, KEY_LVL32_INTRA_NUM, rc_task->info.lvl32_intra_num);
        mpp_meta_set_s32(meta, KEY_LVL16_INTRA_NUM, rc_task->info.lvl16_intra_num);
        mpp_meta_set_s32(meta, KEY_LVL8_INTRA_NUM,  rc_task->info.lvl8_intra_num);
        mpp_meta_set_s32(meta, KEY_LVL4_INTRA_NUM,  rc_task->info.lvl4_intra_num);

        mpp_meta_set_s64(meta, KEY_ENC_SSE,  rc_task->info.sse);
        mpp_meta_set_s32(meta, KEY_OUTPUT_PSKIP,    frm->force_pskip || is_pskip);
        mpp_meta_set_s32(meta, KEY_ENC_BPS_RT, rc_task->info.rt_bits);

        if (rc_task->info.frame_type == INTER_VI_FRAME)
            mpp_meta_set_s32(meta, KEY_ENC_USE_LTR, rc_task->cpb.refr.lt_idx);
    }
    /* frame type */
    mpp_meta_set_s32(meta, KEY_OUTPUT_INTRA,    frm->is_intra);

    /* start qp and average qp */
    mpp_meta_set_s32(meta, KEY_ENC_START_QP,    rc_task->info.quality_target);
    mpp_meta_set_s32(meta, KEY_ENC_AVERAGE_QP,  rc_task->info.quality_real);

    if (hal_task->md_info)
        mpp_meta_set_buffer(meta, KEY_MOTION_INFO, hal_task->md_info);

    if (mpp->mEncAyncIo)
        mpp_meta_set_frame(meta, KEY_INPUT_FRAME, hal_task->frame);

    return MPP_OK;
}